

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::Optimize(Inline *this,Func *func,Instr **callerArgOuts,ArgSlot callerArgOutCount,
                uint recursiveInlineDepth)

{
  byte *pbVar1;
  Type *ppSVar2;
  boolean *pbVar3;
  char cVar4;
  byte bVar5;
  unsigned_short uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Opnd *pOVar12;
  code *pcVar13;
  undefined4 *puVar14;
  bool bVar15;
  OpndKind OVar16;
  bool bVar17;
  ProfileId PVar18;
  ValueType VVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ProfileId PVar19;
  int iVar24;
  JITTimeFunctionBody *pJVar25;
  FunctionJITTimeInfo *pFVar26;
  Func *pFVar27;
  undefined7 extraout_var;
  char *pcVar28;
  SymOpnd *this_00;
  SymOpnd *this_01;
  Func *pFVar29;
  Func *pFVar30;
  Instr *this_02;
  PropertySymOpnd *pPVar31;
  StackSym *pSVar32;
  ByteCodeUsesInstr *this_03;
  ProfiledInstr *pPVar33;
  char16 *pcVar34;
  char16 *pcVar35;
  intptr_t iVar36;
  intptr_t iVar37;
  undefined7 extraout_var_00;
  undefined6 in_register_0000000a;
  ulong uVar38;
  Func *pFVar39;
  undefined1 isBuiltIn;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar40;
  Phase phase;
  Func *pFVar41;
  undefined8 uVar42;
  undefined **ppuVar43;
  char16_t *pcVar44;
  uint uVar45;
  char16_t *pcVar46;
  char16_t *pcVar47;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_148 [4];
  uint16 constantArguments;
  Instr **local_f0;
  Phases *local_e8;
  Func *local_e0;
  Phases *local_d8;
  Instr *local_d0;
  undefined4 local_c4;
  ulong local_c0;
  undefined4 local_b8;
  uint local_b4;
  Func *local_b0;
  ulong local_a8;
  Func *local_a0;
  StackSym *local_98;
  Func *local_90;
  Func *local_88;
  undefined4 *local_80;
  Func *local_78;
  byte local_69;
  Func *local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  char cStack_58;
  uint16 constantArguments_1;
  ValueType builtInReturnType;
  Func *local_40;
  bool local_31 [8];
  bool isInlined;
  
  local_c4 = (undefined4)CONCAT62(in_register_0000000a,callerArgOutCount);
  local_f0 = callerArgOuts;
  local_78 = func;
  bVar15 = Func::DoGlobOpt(func);
  if (!bVar15) {
    return;
  }
  bVar15 = Func::DoGlobOpt(this->topFunc);
  pFVar27 = local_78;
  if (!bVar15) {
    return;
  }
  local_a8 = (ulong)recursiveInlineDepth;
  pJVar25 = JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
  uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
  pFVar26 = JITTimeWorkItem::GetJITTimeInfo(pFVar27->m_workItem);
  uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
  uVar38 = (ulong)uVar22;
  local_69 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FixedMethodsPhase,uVar21,uVar22);
  pFVar27 = (Func *)JITTimeWorkItem::GetJITTimeInfo(pFVar27->m_workItem);
  uVar21 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)pFVar27);
  local_b8 = (undefined4)CONCAT71((int7)(uVar38 >> 8),1);
  if (uVar21 == 0) {
    bVar15 = FunctionJITTimeInfo::IsLdFldInlineePresent((FunctionJITTimeInfo *)pFVar27);
    local_b8 = (undefined4)CONCAT71(extraout_var,bVar15);
  }
  pJVar25 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
  uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
  pFVar26 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
  uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
  bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar21,uVar22);
  pFVar39 = local_78;
  if (!bVar15) {
    pJVar25 = JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
    uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
    pFVar26 = JITTimeWorkItem::GetJITTimeInfo(pFVar39->m_workItem);
    uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
    bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar21,uVar22);
    if ((!bVar15) && (bVar15 = Func::IsJitInDebugMode(local_78), !bVar15)) goto LAB_0053d8ea;
  }
  local_b8 = 0;
LAB_0053d8ea:
  local_78->actualCount = (ArgSlot)local_c4;
  this->currentForInDepth = local_78->m_forInLoopBaseDepth;
  this->lastStatementBoundary = (PragmaInstr *)0x0;
  pFVar39 = (Func *)local_78->m_headInstr;
  if (pFVar39 != (Func *)0x0) {
    ppuVar43 = &PTR_01548f08;
    local_80 = (undefined4 *)__tls_get_addr();
    local_69 = local_69 ^ 1;
    local_e0 = (Func *)&DAT_015bc490;
    local_e8 = (Phases *)&DAT_015b6718;
    local_90 = (Func *)&DAT_015a4e90;
    local_d8 = (Phases *)&DAT_01599240;
    local_98 = (StackSym *)0x0;
    local_b0 = (Func *)0x0;
    local_b4 = 0;
    pcVar28 = (char *)ppuVar43;
    local_88 = (Func *)this;
    do {
      puVar14 = local_80;
      pFVar29 = local_90;
      local_40 = *(Func **)&((JITTimeFunctionBody *)&pFVar39->m_threadContextInfo)->m_bodyData;
      local_31[0] = false;
      pFVar41 = (Func *)0x0;
      if ((char)local_b8 == '\0') goto LAB_0053e64d;
      uVar7 = (ushort)pFVar39->constructorCacheCount;
      if (uVar7 < 199) {
        if (0x67 < uVar7) {
          if (uVar7 < 0xb4) {
            if ((uVar7 != 0x68) && (uVar7 != 0x70)) goto LAB_0053e107;
LAB_0053db74:
            pcVar28 = (char *)pFVar27;
            bVar15 = FunctionJITTimeInfo::IsLdFldInlineePresent((FunctionJITTimeInfo *)pFVar27);
            if (!bVar15) goto LAB_0053df25;
            pFVar41 = (Func *)0x0;
            if ((*(char *)((long)&pFVar39->constructorCaches + 1) != '\x04') ||
               (pFVar41 = (Func *)0x0, ((ulong)pFVar39->propertyGuardsByPropertyId & 0x80000) == 0))
            goto LAB_0053e64d;
            uVar6 = (unsigned_short)pFVar39->constructorCacheCount;
            pFVar29 = (Func *)(&pFVar39->pinnedTypeRefs)[uVar6 != 0x70];
            if (pFVar29 == (Func *)0x0) {
              bVar15 = false;
              pFVar41 = (Func *)0x0;
              isBuiltIn = false;
              goto LAB_0053e650;
            }
            pcVar28 = (char *)pFVar29;
            OVar16 = IR::Opnd::GetKind((Opnd *)pFVar29);
            if ((OVar16 == OpndKindSym) &&
               (this_00 = IR::Opnd::AsSymOpnd((Opnd *)pFVar29), pcVar28 = (char *)pFVar29,
               this_00->m_sym->m_kind == SymKindProperty)) {
              this_01 = IR::Opnd::AsSymOpnd(&this_00->super_Opnd);
              bVar15 = IR::SymOpnd::IsPropertySymOpnd(this_01);
              if (!bVar15) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = local_80;
                *local_80 = 1;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                    ,0x83,"(symOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                                    "symOpnd->AsSymOpnd()->IsPropertySymOpnd()");
                if (!bVar15) goto LAB_0053f459;
                *puVar14 = 0;
              }
              pPVar31 = IR::Opnd::AsPropertySymOpnd(&this_00->super_Opnd);
              _cStack_58 = (Func *)CONCAT44(_constantArguments_1,pPVar31->m_inlineCacheIndex);
              pcVar28 = (char *)pFVar27;
              pFVar29 = (Func *)FunctionJITTimeInfo::GetLdFldInlinee
                                          ((FunctionJITTimeInfo *)pFVar27,
                                           pPVar31->m_inlineCacheIndex);
              if ((pFVar29 == (Func *)0x0) ||
                 (pcVar28 = (char *)pFVar29,
                 pJVar25 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pFVar29),
                 pJVar25 == (JITTimeFunctionBody *)0x0)) goto LAB_0053df04;
              uVar21 = FunctionJITTimeInfo::GetSourceContextId((FunctionJITTimeInfo *)pFVar29);
              uVar22 = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pFVar29);
              pcVar28 = (char *)local_90;
              bVar15 = Js::Phases::IsEnabled((Phases *)local_90,InlineCandidatePhase,uVar21,uVar22);
              if (!bVar15) {
                uVar21 = FunctionJITTimeInfo::GetSourceContextId((FunctionJITTimeInfo *)pFVar29);
                uVar22 = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pFVar29);
                pcVar28 = (char *)local_90;
                bVar15 = Js::Phases::IsEnabled
                                   ((Phases *)local_90,InlineAccessorsPhase,uVar21,uVar22);
                if (!bVar15) {
                  uVar21 = FunctionJITTimeInfo::GetSourceContextId((FunctionJITTimeInfo *)pFVar29);
                  uVar22 = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pFVar29);
                  if (uVar6 == 0x70) {
                    phase = InlineSettersPhase;
                  }
                  else {
                    phase = InlineGettersPhase;
                  }
                  pcVar28 = (char *)local_90;
                  bVar15 = Js::Phases::IsEnabled((Phases *)local_90,phase,uVar21,uVar22);
                  if (!bVar15) {
                    pcVar28 = (char *)this;
                    InlineGetterSetterFunction
                              (this,(Instr *)pFVar39,(FunctionJITTimeInfo *)pFVar29,local_98,
                               _cStack_58,uVar6 != 0x70,local_31,(uint)local_a8);
                    goto LAB_0053e0f5;
                  }
                }
              }
              goto LAB_0053f1d8;
            }
LAB_0053e0f5:
            pFVar41 = (Func *)0x0;
            isBuiltIn = 0;
LAB_0053e0fe:
            bVar15 = false;
            goto LAB_0053e650;
          }
          if (uVar7 == 0xb4) {
            if (((Opnd *)pFVar39->pinnedTypeRefs == (Opnd *)0x0) ||
               (OVar16 = IR::Opnd::GetKind((Opnd *)pFVar39->pinnedTypeRefs), OVar16 != OpndKindReg))
            {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                  ,0x210,"(instr->GetDst() && instr->GetDst()->IsRegOpnd())",
                                  "instr->GetDst() && instr->GetDst()->IsRegOpnd()");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
            }
            if (local_98 != (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar14 = 1;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                  ,0x211,"(symThis == nullptr)","symThis == nullptr");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
            }
            pFVar29 = (Func *)pFVar39->pinnedTypeRefs;
LAB_0053e094:
            pcVar28 = (char *)pFVar29;
            OVar16 = IR::Opnd::GetKind((Opnd *)pFVar29);
            if (OVar16 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = local_80;
              *local_80 = 1;
              pcVar28 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
              ;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                  ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
            }
            local_98 = *(StackSym **)
                        &((JITTimeFunctionBody *)&pFVar29->m_threadContextInfo)->m_bodyData;
            goto LAB_0053e0f5;
          }
          if (uVar7 != 0xc4) goto LAB_0053e107;
          pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                              ((JITTimeWorkItem *)
                               (((Func *)this)->m_alloc->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.mallocBlocks);
          uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
          pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                              ((JITTimeWorkItem *)
                               (((Func *)this)->m_alloc->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.mallocBlocks);
          uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
          uVar42 = 0;
          pcVar28 = (char *)pFVar29;
          bVar15 = Js::Phases::IsEnabled((Phases *)pFVar29,InlineConstructorsPhase,uVar21,uVar22);
          pFVar41 = (Func *)CONCAT71((int7)((ulong)uVar42 >> 8),1);
          if (!bVar15) goto LAB_0053ddb0;
LAB_0053df2a:
          isBuiltIn = false;
          goto LAB_0053df2e;
        }
        if (uVar7 < 0x59) {
          pFVar41 = (Func *)0x0;
          if (uVar7 != 0x1f) {
            if (uVar7 == 0x21) {
              uVar21 = *(uint *)&((Func *)this)->m_runtimeInfo;
              pcVar28 = (char *)pFVar27;
              uVar22 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)pFVar27);
              this = (Inline *)local_88;
              if (uVar21 == uVar22) {
LAB_0053db54:
                pFVar41 = (Func *)0x0;
                this = (Inline *)local_88;
                goto LAB_0053df2a;
              }
              if (*(char *)((long)&pFVar39->constructorCaches + 1) == '\x04') {
                PVar19 = *(ProfileId *)&pFVar39->propertyGuardsByPropertyId;
                pcVar28 = (char *)JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
                PVar18 = JITTimeFunctionBody::GetProfiledCallSiteCount
                                   ((JITTimeFunctionBody *)pcVar28);
                if (((PVar19 < PVar18) &&
                    (pcVar28 = (char *)pFVar27,
                    pFVar26 = FunctionJITTimeInfo::GetInlinee((FunctionJITTimeInfo *)pFVar27,PVar19)
                    , pFVar26 != (FunctionJITTimeInfo *)0x0)) &&
                   (pcVar28 = (char *)pFVar39, bVar15 = Lowerer::IsSpreadCall((Instr *)pFVar39),
                   bVar15)) {
                  pcVar28 = (char *)this;
                  InlineSpread(this,(Instr *)pFVar39);
                }
                goto LAB_0053e0f5;
              }
              goto LAB_0053df04;
            }
            goto LAB_0053e107;
          }
LAB_0053ddb0:
          _cStack_58 = pFVar41;
          pFVar30 = (Func *)GetMethodLdOpndForCallInstr((Inline *)pcVar28,(Instr *)pFVar39);
          uVar21 = *(uint *)&((Func *)this)->m_runtimeInfo;
          pcVar28 = (char *)pFVar27;
          uVar22 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)pFVar27);
          this = (Inline *)local_88;
          if (uVar21 == uVar22) {
            if (pFVar30 != (Func *)0x0) {
              pcVar28 = (char *)pFVar30;
              bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                 ((PropertySymOpnd *)pFVar30);
              if (bVar15) {
                pFVar30->constructorCaches = (JITTimeConstructorCache **)0x0;
                pbVar1 = (byte *)((long)&pFVar30->ctorCachesByPropertyId + 1);
                *pbVar1 = *pbVar1 & 0xfe;
                *(undefined2 *)((long)&pFVar30->ctorCachesByPropertyId + 2) = 0;
              }
              lVar11 = *(long *)&pFVar30->constructorCacheCount;
              this = (Inline *)local_88;
LAB_0053e486:
              bVar15 = lVar11 == 0;
              goto LAB_0053e492;
            }
LAB_0053e891:
            bVar15 = false;
            pFVar41 = _cStack_58;
            isBuiltIn = false;
          }
          else {
            local_68 = pFVar30;
            if (*(char *)((long)&pFVar39->constructorCaches + 1) != '\x04') {
              if (pFVar30 != (Func *)0x0) {
                pcVar28 = (char *)pFVar30;
                bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                   ((PropertySymOpnd *)pFVar30);
                if (bVar15) {
                  pFVar30->constructorCaches = (JITTimeConstructorCache **)0x0;
                  pbVar1 = (byte *)((long)&pFVar30->ctorCachesByPropertyId + 1);
                  *pbVar1 = *pbVar1 & 0xfe;
                  *(undefined2 *)((long)&pFVar30->ctorCachesByPropertyId + 2) = 0;
                }
                lVar11 = *(long *)&pFVar30->constructorCacheCount;
                goto LAB_0053e486;
              }
              goto LAB_0053e891;
            }
            uVar8 = *(uint *)&pFVar39->propertyGuardsByPropertyId;
            uVar45 = uVar8 & 0xffff;
            pcVar28 = (char *)JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
            PVar19 = JITTimeFunctionBody::GetProfiledCallSiteCount((JITTimeFunctionBody *)pcVar28);
            pFVar30 = local_68;
            this = (Inline *)local_88;
            if (PVar19 <= uVar45) {
              if (local_68 == (Func *)0x0) {
                isBuiltIn = false;
                bVar15 = false;
                pFVar41 = _cStack_58;
                goto LAB_0053e650;
              }
              pcVar28 = (char *)local_68;
              bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                 ((PropertySymOpnd *)local_68);
              if (bVar15) {
                pFVar30->constructorCaches = (JITTimeConstructorCache **)0x0;
                pbVar1 = (byte *)((long)&pFVar30->ctorCachesByPropertyId + 1);
                *pbVar1 = *pbVar1 & 0xfe;
                *(undefined2 *)((long)&pFVar30->ctorCachesByPropertyId + 2) = 0;
              }
              bVar15 = *(long *)&pFVar30->constructorCacheCount == 0;
LAB_0053e492:
              pFVar41 = _cStack_58;
              if ((!bVar15) && (-1 < *(char *)&pFVar30->ctorCachesByPropertyId)) {
                *(undefined8 *)&pFVar30->constructorCacheCount = 0;
              }
              goto LAB_0053e64d;
            }
            PVar19 = (ProfileId)uVar8;
            pFVar41 = (Func *)FunctionJITTimeInfo::GetInlinee((FunctionJITTimeInfo *)pFVar27,PVar19)
            ;
            local_c0 = (ulong)uVar45;
            if (pFVar41 == (Func *)0x0) {
              pcVar28 = (char *)local_78;
              bVar15 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>(local_78);
              if ((bVar15) &&
                 (pcVar28 = (char *)this,
                 this_02 = TryGetCallbackDefInstrForCallInstr(this,(Instr *)pFVar39),
                 this_02 != (Instr *)0x0)) {
LAB_0053e8d8:
                pFVar29 = local_68;
                pPVar33 = IR::Instr::AsProfiledInstr(this_02);
                uVar7 = (pPVar33->u).field_3.fldInfoData.f1;
                local_d0 = this_02;
                pFVar26 = JITTimeWorkItem::GetJITTimeInfo(this_02->m_func->m_workItem);
                local_a0 = (Func *)FunctionJITTimeInfo::GetCallbackInlinee(pFVar26,uVar7);
                pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                    ((JITTimeWorkItem *)
                                     (((Func *)this)->m_alloc->super_ArenaAllocator).
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     .super_ArenaData.mallocBlocks);
                uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                    ((JITTimeWorkItem *)
                                     (((Func *)this)->m_alloc->super_ArenaAllocator).
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     .super_ArenaData.mallocBlocks);
                uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                bVar15 = Js::Phases::IsEnabled
                                   ((Phases *)local_e0,InlineCallbacksPhase,uVar21,uVar22);
                if (!bVar15) {
                  pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                      ((JITTimeWorkItem *)
                                       (((Func *)this)->m_alloc->super_ArenaAllocator).
                                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                       .super_ArenaData.mallocBlocks);
                  uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                  pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                      ((JITTimeWorkItem *)
                                       (((Func *)this)->m_alloc->super_ArenaAllocator).
                                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                       .super_ArenaData.mallocBlocks);
                  uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                  bVar15 = Js::Phases::IsEnabled(local_e8,InlineCallbacksPhase,uVar21,uVar22);
                  if (!bVar15) goto LAB_0053ea16;
                }
                pJVar25 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pFVar27);
                pcVar34 = JITTimeFunctionBody::GetDisplayName(pJVar25);
                pFVar29 = local_68;
                pcVar35 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pFVar27,(wchar (*) [42])local_148);
                Output::Print(L"INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n",
                              (ulong)uVar7,pcVar34,pcVar35);
                Output::Flush();
                goto LAB_0053ea16;
              }
              pFVar30 = local_68;
              if (local_68 == (Func *)0x0) goto LAB_0053e891;
              pcVar28 = (char *)local_68;
              bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                 ((PropertySymOpnd *)local_68);
              if (bVar15) {
                pFVar30->constructorCaches = (JITTimeConstructorCache **)0x0;
                pbVar1 = (byte *)((long)&pFVar30->ctorCachesByPropertyId + 1);
                *pbVar1 = *pbVar1 & 0xfe;
                *(undefined2 *)((long)&pFVar30->ctorCachesByPropertyId + 2) = 0;
              }
              bVar15 = *(long *)&pFVar30->constructorCacheCount == 0;
              goto LAB_0053e492;
            }
            bVar15 = FunctionJITTimeInfo::IsPolymorphicCallSite
                               ((FunctionJITTimeInfo *)pFVar27,PVar19);
            if (bVar15) {
              bVar15 = Js::PhaseIsEnabled::InlineCallbacksPhase<Func*>(local_78);
              if ((bVar15) &&
                 (this_02 = TryGetCallbackDefInstrForCallInstr(this,(Instr *)pFVar39),
                 this_02 != (Instr *)0x0)) goto LAB_0053e8d8;
              if (cStack_58 == '\0') {
                pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                    ((JITTimeWorkItem *)
                                     (((Func *)this)->m_alloc->super_ArenaAllocator).
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     .super_ArenaData.mallocBlocks);
                uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                    ((JITTimeWorkItem *)
                                     (((Func *)this)->m_alloc->super_ArenaAllocator).
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     .super_ArenaData.mallocBlocks);
                uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                bVar15 = Js::Phases::IsEnabled
                                   ((Phases *)pFVar29,PolymorphicInlinePhase,uVar21,uVar22);
                pFVar29 = local_78;
                if (!bVar15) {
                  pJVar25 = JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
                  uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                  pFVar41 = local_90;
                  pFVar26 = JITTimeWorkItem::GetJITTimeInfo(pFVar29->m_workItem);
                  uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                  bVar15 = Js::Phases::IsEnabled
                                     ((Phases *)pFVar41,PolymorphicInlinePhase,uVar21,uVar22);
                  if (!bVar15) {
                    bVar15 = IsInliningOutSideLoops(this);
                    if (bVar15) {
                      pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                          ((JITTimeWorkItem *)
                                           (((Func *)this)->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                      pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                          ((JITTimeWorkItem *)
                                           (((Func *)this)->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                      bVar15 = Js::Phases::IsEnabled(local_d8,InlinePhase,uVar21,uVar22);
                      pFVar29 = local_78;
                      if (!bVar15) {
                        pJVar25 = JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
                        uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                        pFVar41 = local_90;
                        pFVar26 = JITTimeWorkItem::GetJITTimeInfo(pFVar29->m_workItem);
                        uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                        bVar15 = Js::Phases::IsEnabled(local_d8,InlinePhase,uVar21,uVar22);
                        if (!bVar15) goto LAB_0053ecf8;
                      }
                    }
                    pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                        ((JITTimeWorkItem *)
                                         (((Func *)this)->m_alloc->super_ArenaAllocator).
                                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                         .super_ArenaData.mallocBlocks);
                    uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                    pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                        ((JITTimeWorkItem *)
                                         (((Func *)this)->m_alloc->super_ArenaAllocator).
                                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                         .super_ArenaData.mallocBlocks);
                    uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                    bVar15 = Js::Phases::IsEnabled
                                       ((Phases *)pFVar41,FixedMethodsPhase,uVar21,uVar22);
                    if (bVar15) {
LAB_0053f0fe:
                      pFVar29 = local_68;
                      if (local_68 != (Func *)0x0) {
                        bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                           ((PropertySymOpnd *)local_68);
                        if (bVar15) {
                          pFVar29->constructorCaches = (JITTimeConstructorCache **)0x0;
                          pbVar1 = (byte *)((long)&pFVar29->ctorCachesByPropertyId + 1);
                          *pbVar1 = *pbVar1 & 0xfe;
                          *(undefined2 *)((long)&pFVar29->ctorCachesByPropertyId + 2) = 0;
                        }
                        if ((*(long *)&pFVar29->constructorCacheCount != 0) &&
                           (-1 < *(char *)&pFVar29->ctorCachesByPropertyId)) {
                          *(undefined8 *)&pFVar29->constructorCacheCount = 0;
                        }
                      }
                      local_40 = (Func *)InlinePolymorphicFunction
                                                   (this,(Instr *)pFVar39,
                                                    (FunctionJITTimeInfo *)pFVar27,local_98,
                                                    (ProfileId)local_c0,local_31,(uint)local_a8,
                                                    false);
                    }
                    else {
                      pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                          ((JITTimeWorkItem *)
                                           (((Func *)this)->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                      pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                          ((JITTimeWorkItem *)
                                           (((Func *)this)->m_alloc->super_ArenaAllocator).
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           .super_ArenaData.mallocBlocks);
                      uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                      bVar15 = Js::Phases::IsEnabled
                                         ((Phases *)local_90,PolymorphicInlineFixedMethodsPhase,
                                          uVar21,uVar22);
                      if (bVar15) goto LAB_0053f0fe;
                      local_40 = (Func *)InlinePolymorphicFunctionUsingFixedMethods
                                                   (this,(Instr *)pFVar39,
                                                    (FunctionJITTimeInfo *)pFVar27,local_98,
                                                    (ProfileId)local_c0,(PropertySymOpnd *)local_68,
                                                    local_31,(uint)local_a8);
                    }
                    bVar15 = true;
                    local_68 = (Func *)((ulong)local_68 & 0xffffffff00000000);
                    goto LAB_0053f395;
                  }
                }
              }
LAB_0053ecf8:
              pcVar44 = (char16_t *)local_e0;
              bVar15 = Js::Phases::IsEnabled((Phases *)local_e0,PolymorphicInlinePhase);
              if (bVar15) {
                pcVar47 = L"false";
                pcVar46 = L"false";
                if ((char)_cStack_58 != '\0') {
                  pcVar46 = L"true";
                }
                if ((Func *)((Func *)this)->m_alloc != local_78) {
                  pcVar47 = L"true";
                }
                pJVar25 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pFVar27);
                pcVar34 = JITTimeFunctionBody::GetDisplayName(pJVar25);
                pcVar35 = FunctionJITTimeInfo::GetDebugNumberSet
                                    ((FunctionJITTimeInfo *)pFVar27,(wchar (*) [42])local_148);
                pcVar44 = 
                L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
                ;
                Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"
                              ,pcVar46,pcVar47,pcVar34,pcVar35);
                Output::Flush();
              }
              pFVar29 = local_68;
              if (local_68 != (Func *)0x0) {
                pcVar44 = (char16_t *)local_68;
                bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                   ((PropertySymOpnd *)local_68);
                if (bVar15) {
                  pFVar29->constructorCaches = (JITTimeConstructorCache **)0x0;
                  pbVar1 = (byte *)((long)&pFVar29->ctorCachesByPropertyId + 1);
                  *pbVar1 = *pbVar1 & 0xfe;
                  *(undefined2 *)((long)&pFVar29->ctorCachesByPropertyId + 2) = 0;
                }
                if ((*(long *)&pFVar29->constructorCacheCount != 0) &&
                   (-1 < *(char *)&pFVar29->ctorCachesByPropertyId)) {
                  *(undefined8 *)&pFVar29->constructorCacheCount = 0;
                }
              }
              bVar15 = true;
              isBuiltIn = false;
              pFVar41 = _cStack_58;
              pcVar28 = (char *)pcVar44;
            }
            else {
              local_d0 = (Instr *)0x0;
              pFVar29 = local_68;
              local_a0 = pFVar41;
LAB_0053ea16:
              if (pFVar29 != (Func *)0x0) {
                bVar15 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo
                                   ((PropertySymOpnd *)pFVar29);
                if (bVar15) {
                  pFVar29->constructorCaches = (JITTimeConstructorCache **)0x0;
                  pbVar1 = (byte *)((long)&pFVar29->ctorCachesByPropertyId + 1);
                  *pbVar1 = *pbVar1 & 0xfe;
                  *(undefined2 *)((long)&pFVar29->ctorCachesByPropertyId + 2) = 0;
                }
                if ((*(long *)&pFVar29->constructorCacheCount != 0) &&
                   (-1 < *(char *)&pFVar29->ctorCachesByPropertyId)) {
                  *(undefined8 *)&pFVar29->constructorCacheCount = 0;
                }
              }
              ValueType::ValueType((ValueType *)&local_5a.field_0);
              pFVar29 = local_a0;
              if (cStack_58 != '\0') {
                iVar36 = FunctionJITTimeInfo::GetFunctionInfoAddr((FunctionJITTimeInfo *)local_a0);
                iVar37 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                                   ((ThreadContextInfo *)
                                    (((Func *)this)->m_alloc->super_ArenaAllocator).
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    .super_ArenaData.bigBlocks);
                if (iVar36 == iVar37) {
                  *(unsigned_short *)&pFVar39->constructorCacheCount = 199;
                  pcVar28 = (char *)pFVar39;
                  pPVar33 = IR::Instr::AsProfiledInstr((Instr *)pFVar39);
                  (pPVar33->u).profileId = 0xffff;
                  pFVar41 = _cStack_58;
                  isBuiltIn = 1;
                  goto LAB_0053e0fe;
                }
              }
              bVar15 = InliningDecider::GetBuiltInInfo
                                 ((FunctionJITTimeInfo *)pFVar29,&local_148[0].bits,
                                  (ValueType *)&local_5a.field_0);
              local_68 = (Func *)CONCAT44(local_68._4_4_,(int)CONCAT71(extraout_var_00,bVar15));
              bVar15 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0);
              pFVar29 = local_90;
              if ((!bVar15) && (pFVar39->pinnedTypeRefs != (TypeRefSet *)0x0)) {
                bVar15 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)local_a0);
                if (bVar15) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar14 = local_80;
                  *local_80 = 1;
                  bVar15 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                      ,0x12a,"(!inlineeData->HasBody())","!inlineeData->HasBody()");
                  if (!bVar15) goto LAB_0053f459;
                  *puVar14 = 0;
                  pFVar29 = local_90;
                }
                if ((unsigned_short)pFVar39->constructorCacheCount == 199) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar14 = local_80;
                  *local_80 = 1;
                  bVar15 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                      ,299,"(instr->m_opcode != Js::OpCode::NewScObjArray)",
                                      "We should have broken out of the switch statement earlier on this opcode."
                                     );
                  pFVar29 = local_90;
                  if (!bVar15) goto LAB_0053f459;
                  *puVar14 = 0;
                  if ((unsigned_short)pFVar39->constructorCacheCount == 199) {
                    local_5c = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                &(pFVar39->pinnedTypeRefs->
                                 super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 ).entries;
                    bVar15 = ValueType::IsLikelyNativeArray((ValueType *)&local_5c.field_0);
                    if (bVar15) goto LAB_0053ebd1;
                  }
                }
                pOVar12 = (Opnd *)pFVar39->pinnedTypeRefs;
                VVar20 = ValueType::ToLikely((ValueType *)&local_5a.field_0);
                IR::Opnd::SetValueType(pOVar12,VVar20);
              }
LAB_0053ebd1:
              pFVar41 = local_a0;
              bVar15 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)local_a0);
              pcVar28 = (char *)pFVar29;
              if (bVar15) {
                uVar21 = FunctionJITTimeInfo::GetSourceContextId((FunctionJITTimeInfo *)pFVar41);
                uVar22 = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pFVar41);
                bVar15 = Js::Phases::IsEnabled((Phases *)pFVar29,InlineCandidatePhase,uVar21,uVar22)
                ;
              }
              else {
                bVar15 = Js::Phases::IsEnabled((Phases *)pFVar29,InlineBuiltInPhase);
              }
              if ((bVar15 != false) ||
                 ((pcVar28 = (char *)local_a0,
                  bVar15 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)local_a0),
                  pFVar41 = local_a0, !bVar15 && (local_148[0].bits == 0)))) {
LAB_0053edf6:
                pFVar41 = _cStack_58;
                isBuiltIn = local_68._0_1_;
                goto LAB_0053e0fe;
              }
              pcVar28 = (char *)local_a0;
              bVar15 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)local_a0);
              if (bVar15) {
                pcVar28 = (char *)FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pFVar41);
                bVar15 = JITTimeFunctionBody::HasProfileInfo((JITTimeFunctionBody *)pcVar28);
                pFVar41 = local_78;
                if (!bVar15) goto LAB_0053edf6;
                local_5c.bits = 0;
                pJVar25 = JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
                uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                pFVar26 = JITTimeWorkItem::GetJITTimeInfo(pFVar41->m_workItem);
                uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                bVar15 = Js::Phases::IsEnabled((Phases *)pFVar29,InlineRecursivePhase,uVar21,uVar22)
                ;
                if (bVar15) {
                  aVar40.bits = 0;
                }
                else {
                  IR::Instr::
                  IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__0>
                            ((Instr *)pFVar39,(anon_class_8_1_406103b2)&local_5c);
                  aVar40 = local_5c;
                }
                this = (Inline *)local_88;
                pFVar29 = (Func *)local_88->m_alloc;
                pcVar28 = (char *)local_88->m_workItem;
                bVar15 = IsInliningOutSideLoops((Inline *)local_88);
                iVar10._0_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 4);
                iVar10._1_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 5);
                iVar10._2_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 6);
                iVar10._3_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 7);
                bVar17 = InliningHeuristics::BackendInlineIntoInliner
                                   ((InliningHeuristics *)pcVar28,(FunctionJITTimeInfo *)local_a0,
                                    local_78,pFVar29,(ProfileId)local_c0,(bool)cStack_58,true,bVar15
                                    ,iVar10 != 0,(uint)local_a8,aVar40.bits);
                bVar15 = true;
                if (bVar17) goto LAB_0053f29b;
                bVar15 = false;
              }
              else {
                if (local_148[0].bits == 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar14 = local_80;
                  *local_80 = 1;
                  pcVar28 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                  ;
                  bVar15 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                      ,0x146,"(builtInInlineCandidateOpCode != 0)",
                                      "builtInInlineCandidateOpCode != 0");
                  if (!bVar15) goto LAB_0053f459;
                  *puVar14 = 0;
                }
                if ((char)_cStack_58 != '\0') {
                  pFVar41 = _cStack_58;
                  isBuiltIn = local_68._0_1_;
                  goto LAB_0053e0fe;
                }
                bVar17 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0);
                bVar15 = true;
                if ((!bVar17) && ((Opnd *)pFVar39->pinnedTypeRefs != (Opnd *)0x0)) {
                  IR::Opnd::SetValueType
                            ((Opnd *)pFVar39->pinnedTypeRefs,(ValueType)local_5a.field_0);
                  bVar15 = ValueType::IsDefinite((ValueType *)&local_5a.field_0);
                  if (bVar15) {
                    pbVar1 = (byte *)((long)&(pFVar39->pinnedTypeRefs->
                                             super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                             ).entries + 3);
                    *pbVar1 = *pbVar1 | 1;
                  }
                  bVar15 = false;
                }
LAB_0053f29b:
                if (local_148[0].bits == 0) {
                  local_40 = (Func *)InlineScriptFunction
                                               (this,(Instr *)pFVar39,
                                                (FunctionJITTimeInfo *)local_a0,local_98,
                                                (ProfileId)local_c0,local_31,local_d0,(uint)local_a8
                                               );
                }
                else {
                  local_40 = (Func *)InlineBuiltInFunction
                                               (this,(Instr *)pFVar39,
                                                (FunctionJITTimeInfo *)local_a0,local_148[0].bits,
                                                (FunctionJITTimeInfo *)pFVar27,local_98,local_31,
                                                (uint)local_c0,(uint)local_a8,(Instr *)pFVar39);
                }
                if (!bVar15 && local_31[0] == false) {
                  pbVar1 = (byte *)((long)&(pFVar39->pinnedTypeRefs->
                                           super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                           ).entries + 3);
                  *pbVar1 = *pbVar1 & 0xfe;
                  pOVar12 = (Opnd *)pFVar39->pinnedTypeRefs;
                  local_5c = (pOVar12->m_valueType).field_0;
                  VVar20 = ValueType::ToLikely((ValueType *)&local_5c.field_0);
                  IR::Opnd::SetValueType(pOVar12,VVar20);
                }
                bVar15 = false;
LAB_0053f395:
                uVar22 = *(int *)&((Func *)this)->m_runtimeInfo + 1;
                *(uint *)&((Func *)this)->m_runtimeInfo = uVar22;
                pcVar28 = (char *)pFVar27;
                uVar21 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)pFVar27);
                this = (Inline *)local_88;
                if (uVar22 == uVar21) {
                  pcVar28 = (char *)pFVar27;
                  bVar17 = FunctionJITTimeInfo::IsLdFldInlineePresent
                                     ((FunctionJITTimeInfo *)pFVar27);
                  this = (Inline *)local_88;
                  pFVar41 = _cStack_58;
                  isBuiltIn = local_68._0_1_;
                  if (!bVar17 && local_69 == 0) {
                    return;
                  }
                  goto LAB_0053e650;
                }
              }
              pFVar41 = _cStack_58;
              isBuiltIn = local_68._0_1_;
            }
          }
        }
        else {
          if (uVar7 == 0x59) {
            pcVar28 = (char *)this;
            InlConstFoldArg(this,(Instr *)pFVar39,local_f0,(ArgSlot)local_c4);
            goto LAB_0053df04;
          }
          if (uVar7 == 0x5e) goto LAB_0053db74;
LAB_0053e107:
          if (local_b0 == (Func *)0x0) {
            pFVar41 = (Func *)0x0;
            local_b0 = (Func *)0x0;
            goto LAB_0053df2a;
          }
          pFVar41 = (Func *)0x0;
          if ((*(char *)((long)&pFVar39->constructorCaches + 1) == '\x02') &&
             (pFVar41 = (Func *)0x0, (Func *)pFVar39->callSiteToArgumentsOffsetFixupMap == local_b0)
             ) {
            local_b4 = local_b4 - 1;
            pFVar41 = (Func *)0x0;
            if (local_b4 == 0) {
              iVar23._0_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 4);
              iVar23._1_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 5);
              iVar23._2_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 6);
              iVar23._3_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 7);
              if (iVar23 == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = local_80;
                *local_80 = 1;
                pcVar28 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                ;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                    ,0x22a,"(this->isInLoop > 0)","this->isInLoop > 0");
                if (!bVar15) goto LAB_0053f459;
                *puVar14 = 0;
                iVar23._0_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 4);
                iVar23._1_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 5);
                iVar23._2_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 6);
                iVar23._3_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 7);
              }
              *(int *)&(((JITTimeFunctionBody *)&((Func *)this)->m_threadContextInfo)->m_bodyData).
                       isWasmFunction = iVar23 + -1;
              bVar15 = false;
              local_b4 = 0;
              local_b0 = (Func *)0x0;
              pFVar41 = (Func *)0x0;
              isBuiltIn = false;
              goto LAB_0053e650;
            }
          }
LAB_0053e64d:
          bVar15 = false;
          isBuiltIn = false;
        }
      }
      else {
        if (0x178 < uVar7) {
          if (uVar7 < 0x20e) {
            if (uVar7 == 0x179) {
              if (*(char *)((long)&pFVar39->constructorCaches + 1) != '\b') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = local_80;
                *local_80 = 1;
                pcVar28 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                ;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                    ,0xb9,"(this->IsPragmaInstr())","Bad call to AsPragmaInstr()");
                if (!bVar15) goto LAB_0053f459;
                *puVar14 = 0;
              }
              ((Func *)this)->m_polymorphicInlineCacheInfo =
                   (JITTimePolymorphicInlineCacheInfo *)pFVar39;
              goto LAB_0053e649;
            }
            if (uVar7 == 0x1b2) {
              uVar21 = *(uint *)&((Func *)this)->m_runtimeInfo;
              pcVar28 = (char *)pFVar27;
              uVar22 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)pFVar27);
              this = (Inline *)local_88;
              if (uVar21 == uVar22) goto LAB_0053db54;
              if (*(char *)((long)&pFVar39->constructorCaches + 1) != '\x04') {
LAB_0053df04:
                pFVar41 = (Func *)0x0;
                isBuiltIn = 0;
                goto LAB_0053e0fe;
              }
              uVar8 = *(uint *)&pFVar39->propertyGuardsByPropertyId;
              pcVar28 = (char *)JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
              PVar19 = JITTimeFunctionBody::GetProfiledCallSiteCount((JITTimeFunctionBody *)pcVar28)
              ;
              if ((uVar8 & 0xffff) < (uint)PVar19) {
                pcVar28 = (char *)pFVar27;
                pFVar41 = (Func *)FunctionJITTimeInfo::GetInlinee
                                            ((FunctionJITTimeInfo *)pFVar27,(ProfileId)uVar8);
                if (pFVar41 == (Func *)0x0) goto LAB_0053df04;
                _cStack_58 = (Func *)(CONCAT44(_constantArguments_1,uVar8) & 0xffffffff0000ffff);
                uVar21 = FunctionJITTimeInfo::GetSourceContextId((FunctionJITTimeInfo *)pFVar41);
                uVar22 = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pFVar41);
                pcVar28 = (char *)pFVar29;
                bVar15 = Js::Phases::IsEnabled((Phases *)pFVar29,InlineCandidatePhase,uVar21,uVar22)
                ;
                if (!bVar15) {
                  local_68 = pFVar41;
                  pcVar28 = (char *)FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)pFVar41);
                  bVar15 = JITTimeFunctionBody::HasProfileInfo((JITTimeFunctionBody *)pcVar28);
                  pFVar41 = local_78;
                  if (bVar15) {
                    local_148[0].bits = 0;
                    pJVar25 = JITTimeWorkItem::GetJITFunctionBody(local_78->m_workItem);
                    uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
                    pFVar26 = JITTimeWorkItem::GetJITTimeInfo(pFVar41->m_workItem);
                    uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
                    bVar15 = Js::Phases::IsEnabled
                                       ((Phases *)pFVar29,InlineRecursivePhase,uVar21,uVar22);
                    if (bVar15) {
                      aVar40.bits = 0;
                    }
                    else {
                      IR::Instr::
                      IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__1>
                                ((Instr *)pFVar39,(anon_class_8_1_406103b2)local_148);
                      aVar40 = local_148[0];
                    }
                    pFVar30 = _cStack_58;
                    pFVar29 = local_88;
                    _cStack_58 = (Func *)local_88->m_alloc;
                    pcVar28 = (char *)local_88->m_workItem;
                    bVar15 = IsInliningOutSideLoops((Inline *)local_88);
                    pFVar41 = local_68;
                    iVar9._0_1_ = *(boolean *)((long)&pFVar29->m_threadContextInfo + 4);
                    iVar9._1_1_ = *(boolean *)((long)&pFVar29->m_threadContextInfo + 5);
                    iVar9._2_1_ = *(boolean *)((long)&pFVar29->m_threadContextInfo + 6);
                    iVar9._3_1_ = *(boolean *)((long)&pFVar29->m_threadContextInfo + 7);
                    bVar15 = InliningHeuristics::BackendInlineIntoInliner
                                       ((InliningHeuristics *)pcVar28,
                                        (FunctionJITTimeInfo *)local_68,local_78,_cStack_58,
                                        (ProfileId)pFVar30,false,true,bVar15,iVar9 != 0,
                                        (uint)local_a8,aVar40.bits);
                    pFVar29 = local_88;
                    if (bVar15) {
                      local_40 = (Func *)InlineScriptFunction
                                                   ((Inline *)local_88,(Instr *)pFVar39,
                                                    (FunctionJITTimeInfo *)pFVar41,local_98,
                                                    (ProfileId)pFVar30,local_31,(Instr *)0x0,
                                                    (uint)local_a8);
                      uVar22 = *(int *)&pFVar29->m_runtimeInfo + 1;
                      *(uint *)&pFVar29->m_runtimeInfo = uVar22;
                      pcVar28 = (char *)pFVar27;
                      uVar21 = FunctionJITTimeInfo::GetInlineeCount((FunctionJITTimeInfo *)pFVar27);
                      if (uVar22 == uVar21) {
                        return;
                      }
                    }
                    this = (Inline *)local_88;
                    pFVar41 = (Func *)0x0;
                    isBuiltIn = 0;
                    goto LAB_0053e0fe;
                  }
                }
              }
LAB_0053f1d8:
              bVar15 = false;
              pFVar41 = (Func *)0x0;
              isBuiltIn = false;
              goto LAB_0053e650;
            }
          }
          else {
            if (uVar7 == 0x20e) {
              if ((pFVar39->singleTypeGuards == (TypePropertyGuardDictionary *)0x0) ||
                 (OVar16 = IR::Opnd::GetKind((Opnd *)pFVar39->singleTypeGuards),
                 OVar16 != OpndKindReg)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                    ,0x218,"(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd())",
                                    "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd()");
                if (!bVar15) goto LAB_0053f459;
                *puVar14 = 0;
              }
              if (local_98 != (StackSym *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                    ,0x219,"(symThis == nullptr)","symThis == nullptr");
                if (!bVar15) goto LAB_0053f459;
                *puVar14 = 0;
              }
              pFVar29 = (Func *)pFVar39->singleTypeGuards;
              goto LAB_0053e094;
            }
            if (uVar7 == 0x220) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = local_80;
              *local_80 = 1;
              pcVar28 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
              ;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                  ,0x58,"(false)","false");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
              goto LAB_0053df25;
            }
          }
          goto LAB_0053e107;
        }
        if (0xe5 < uVar7) {
          if (uVar7 == 0xe6) {
            pcVar28 = (char *)local_78->m_workItem;
            bVar15 = JITTimeWorkItem::IsLoopBody((JITTimeWorkItem *)pcVar28);
            if (bVar15) goto LAB_0053df25;
            if (*(char *)((long)&pFVar39->constructorCaches + 1) != '\x02') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = local_80;
              *local_80 = 1;
              pcVar28 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
              ;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
            }
            ppSVar2 = &pFVar39->callSiteToArgumentsOffsetFixupMap[2].entries;
            *(byte *)ppSVar2 = *(byte *)ppSVar2 | 0x10;
          }
          else {
            if (uVar7 != 0x176) goto LAB_0053e107;
            if (local_b0 == (Func *)0x0) {
              cVar4 = *(char *)((long)&pFVar39->constructorCaches + 1);
              if ((cVar4 != '\x03') && (cVar4 != '\x05')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = local_80;
                *local_80 = 1;
                pcVar28 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                ;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                    ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                if (!bVar15) goto LAB_0053f459;
                *puVar14 = 0;
              }
              if (((ulong)pFVar39->propertiesWrittenTo & 1) == 0) {
                local_b0 = (Func *)0x0;
              }
              else {
                cVar4 = *(char *)((long)&pFVar39->constructorCaches + 1);
                if ((cVar4 != '\x03') && (cVar4 != '\x05')) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar14 = local_80;
                  *local_80 = 1;
                  pcVar28 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                  ;
                  bVar15 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                      ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                  if (!bVar15) goto LAB_0053f459;
                  *puVar14 = 0;
                }
                pbVar3 = &(((JITTimeFunctionBody *)&((Func *)this)->m_threadContextInfo)->m_bodyData
                          ).isWasmFunction;
                *(int *)pbVar3 = *(int *)pbVar3 + 1;
                local_b4 = *(uint *)&pFVar39->ctorCachesByPropertyId;
                local_b0 = pFVar39;
              }
            }
            cVar4 = *(char *)((long)&pFVar39->constructorCaches + 1);
            if ((cVar4 != '\x03') && (cVar4 != '\x05')) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = local_80;
              *local_80 = 1;
              pcVar28 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
              ;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
            }
            pFVar41 = (Func *)0x0;
            if (((ulong)pFVar39->propertiesWrittenTo & 0x10) == 0) goto LAB_0053e64d;
            iVar24._0_1_ = *(byte *)&((Func *)this)->m_threadContextInfo;
            iVar24._1_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 1);
            iVar24._2_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 2);
            iVar24._3_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 3);
            if (iVar24 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = local_80;
              *local_80 = 1;
              pcVar28 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
              ;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                  ,0x49,"(this->currentForInDepth != 0)",
                                  "this->currentForInDepth != 0");
              if (!bVar15) goto LAB_0053f459;
              *puVar14 = 0;
              iVar24._0_1_ = *(byte *)&((Func *)this)->m_threadContextInfo;
              iVar24._1_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 1);
              iVar24._2_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 2);
              iVar24._3_1_ = *(boolean *)((long)&((Func *)this)->m_threadContextInfo + 3);
            }
            *(int *)&((JITTimeFunctionBody *)&((Func *)this)->m_threadContextInfo)->m_bodyData =
                 iVar24 + -1;
          }
LAB_0053e649:
          pFVar41 = (Func *)0x0;
          goto LAB_0053e64d;
        }
        pFVar41 = (Func *)&DAT_00000001;
        if (uVar7 != 199) {
          if (uVar7 == 0xe4) {
            pcVar28 = (char *)local_78->m_workItem;
            bVar15 = JITTimeWorkItem::IsLoopBody((JITTimeWorkItem *)pcVar28);
            if (!bVar15) {
              *(int *)&((JITTimeFunctionBody *)&((Func *)this)->m_threadContextInfo)->m_bodyData =
                   *(int *)&((JITTimeFunctionBody *)&((Func *)this)->m_threadContextInfo)->
                            m_bodyData + 1;
            }
LAB_0053df25:
            pFVar41 = (Func *)0x0;
            goto LAB_0053df2a;
          }
          goto LAB_0053e107;
        }
        isBuiltIn = true;
LAB_0053df2e:
        bVar15 = false;
      }
LAB_0053e650:
      if (local_31[0] == false) {
        uVar6 = (unsigned_short)pFVar39->constructorCacheCount;
        if (uVar6 != 0x1f) {
          if ((uVar6 != 199) && (uVar6 != 0xc4)) goto LAB_0053e866;
          pFVar41 = (Func *)CONCAT71((int7)((ulong)pFVar41 >> 8),1);
        }
        _cStack_58 = pFVar41;
        pPVar31 = GetMethodLdOpndForCallInstr((Inline *)pcVar28,(Instr *)pFVar39);
        if (pPVar31 != (PropertySymOpnd *)0x0) {
          bVar17 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(pPVar31);
          if (bVar17) {
            pPVar31->objTypeSpecFldInfo = (ObjTypeSpecFldInfo *)0x0;
            pPVar31->field_0x61 = pPVar31->field_0x61 & 0xfe;
            pPVar31->slotIndex = 0;
          }
          if ((pPVar31->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0) &&
             (-1 < (char)pPVar31->m_polyCacheUtil)) {
            pPVar31->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
          }
        }
        pSVar32 = IR::Opnd::GetStackSym((Opnd *)pFVar39->singleTypeGuards);
        bVar5 = *(byte *)((long)&pFVar39->singleTypeGuards->entries + 3);
        local_5a.bits =
             local_5a.bits &
             ~(IntIsLikelyUntagged|IntCanBeUntagged|Int|Object|CanBeTaggedValue|Null|Undefined|
              Likely);
        pcVar28 = (char *)local_88;
        bVar15 = TryOptimizeCallInstrWithFixedMethod
                           ((Inline *)local_88,(Instr *)pFVar39,(FunctionJITTimeInfo *)0x0,bVar15,
                            (bool)isBuiltIn,(bool)cStack_58,false,(bool *)&local_5a,false,0);
        this = (Inline *)local_88;
        if (bVar15) {
          if (pSVar32 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = local_80;
            *local_80 = 1;
            bVar15 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                ,0x249,"(originalCallTargetStackSym != nullptr)",
                                "originalCallTargetStackSym != nullptr");
            if (!bVar15) {
LAB_0053f459:
              pcVar13 = (code *)invalidInstructionException();
              (*pcVar13)();
            }
            *puVar14 = 0;
          }
          pFVar29 = local_90;
          this_03 = IR::ByteCodeUsesInstr::New((Instr *)pFVar39);
          IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                    (this_03,(bool)((bVar5 & 8) >> 3),(pSVar32->super_Sym).m_id);
          pcVar28 = (char *)pFVar39;
          IR::Instr::InsertBefore((Instr *)pFVar39,&this_03->super_Instr);
          this = (Inline *)local_88;
          if ((unsigned_short)pFVar39->constructorCacheCount == 0xc4) {
            pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                                ((JITTimeWorkItem *)
                                 (local_88->m_alloc->super_ArenaAllocator).
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .super_ArenaData.mallocBlocks);
            uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
            pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                                ((JITTimeWorkItem *)
                                 (((Func *)this)->m_alloc->super_ArenaAllocator).
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .super_ArenaData.mallocBlocks);
            uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
            bVar15 = Js::Phases::IsEnabled((Phases *)pFVar29,SplitNewScObjectPhase,uVar21,uVar22);
            pcVar28 = (char *)pFVar29;
            if (!bVar15) {
              pcVar28 = (char *)this;
              SplitConstructorCall(this,(Instr *)pFVar39,false,true,(Instr **)0x0,(Instr **)0x0);
            }
          }
        }
        else if (((unsigned_short)pFVar39->constructorCacheCount == 199) &&
                (pFVar39->pinnedTypeRefs != (TypeRefSet *)0x0)) {
          local_148[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                          &(pFVar39->pinnedTypeRefs->
                           super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                           ).entries;
          bVar15 = ValueType::IsLikelyNativeArray((ValueType *)&local_148[0].field_0);
          pcVar28 = (char *)pFVar39;
          if (bVar15) {
            IR::Instr::ConvertToBailOutInstr
                      ((Instr *)pFVar39,(Instr *)pFVar39,BailOutOnNotNativeArray,0xffffffff);
            pcVar28 = (char *)pFVar39;
          }
        }
      }
LAB_0053e866:
      pFVar39 = local_40;
    } while (local_40 != (Func *)0x0);
  }
  pJVar25 = JITTimeWorkItem::GetJITFunctionBody
                      ((JITTimeWorkItem *)
                       (((Func *)this)->m_alloc->super_ArenaAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_ArenaData.mallocBlocks);
  uVar21 = JITTimeFunctionBody::GetSourceContextId(pJVar25);
  pFVar26 = JITTimeWorkItem::GetJITTimeInfo
                      ((JITTimeWorkItem *)
                       (((Func *)this)->m_alloc->super_ArenaAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_ArenaData.mallocBlocks);
  uVar22 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar26);
  bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,InlinePhase,uVar21,uVar22);
  if ((bVar15) || (bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase), bVar15)) {
    Output::Flush();
  }
  return;
}

Assistant:

void
Inline::Optimize(Func *func, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount, uint recursiveInlineDepth)
{
    if (!func->DoInline() || !topFunc->DoInline())
    {
        return;
    }

    bool doFixedMethods = !PHASE_OFF(Js::FixedMethodsPhase, func);
    const FunctionJITTimeInfo * inlinerData = func->GetWorkItem()->GetJITTimeInfo();

    bool doInline = (inlinerData->GetInlineeCount() > 0 || inlinerData->IsLdFldInlineePresent());
    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, func) ||
        func->IsJitInDebugMode())
    {
        doInline = false;
    }

    func->actualCount = callerArgOutCount;

    // Current for..in depth starts with the inlinee's base depth
    this->currentForInDepth = func->m_forInLoopBaseDepth;

    // Keep the caller's "this" symbol (if any).
    StackSym *symThis = nullptr;
    lastStatementBoundary = nullptr;
    IR::LabelInstr* loopTop = nullptr;
    int32 backEdgeCount = 0;

    // Profile data already filter call site outside of loops if the function has loops, so we don't need to detect that here.
    FOREACH_INSTR_EDITING(instr, instrNext, func->m_headInstr)
    {
        bool isInlined = false;
        bool isPolymorphic = false;
        bool isBuiltIn = false;
        bool isCtor = false;
        if (doInline)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::StatementBoundary:
                lastStatementBoundary = instr->AsPragmaInstr();
                break;

            case Js::OpCode::Label:
                {
                    if (!loopTop && instr->AsLabelInstr()->m_isLoopTop)
                    {
                        // We only need to know if we are inside loop or not, it doesn't matter how many nested levels we are in.
                        // This is the cheap way of doing so.
                        loopTop = instr->AsLabelInstr();
                        AnalysisAssert(loopTop);
                        this->isInLoop++;
                        backEdgeCount = loopTop->labelRefs.Count();
                    }

                    if (instr->AsLabelInstr()->m_isForInExit)
                    {
                        AssertOrFailFast(this->currentForInDepth != 0);
                        this->currentForInDepth--;
                    }
                }
                break;
            case Js::OpCode::InitForInEnumerator:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    this->currentForInDepth++;
                }
                break;
            case Js::OpCode::BrOnNotEmpty:
                // Byte code doesn't emit BrOnNotEmpty, and we have done any transformation yet.
                Assert(false);
                break;
            case Js::OpCode::BrOnEmpty:
                // Loop body uses the for in enumerator in the interpreter frame.
                // No need to keep track of its depth
                if (!func->IsLoopBody())
                {
                    instr->AsBranchInstr()->GetTarget()->m_isForInExit = true;
                }
                break;
            case Js::OpCode::StFld:
            case Js::OpCode::LdFld:
            case Js::OpCode::LdFldForCallApplyTarget:
                {
                    // Try inlining of getter setter
                    if (!inlinerData->IsLdFldInlineePresent())
                    {
                        break;
                    }

                    if (!instr->IsProfiledInstr())
                    {
                        break;
                    }

                    if (!(instr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfoFlags::FldInfo_FromAccessor))
                    {
                        break;
                    }

                    bool getter = instr->m_opcode != Js::OpCode::StFld;

                    IR::Opnd *opnd = getter ? instr->GetSrc1() : instr->GetDst();
                    if (!(opnd && opnd->IsSymOpnd()))
                    {
                        break;
                    }

                    IR::SymOpnd* symOpnd = opnd->AsSymOpnd();
                    if (!symOpnd->m_sym->IsPropertySym())
                    {
                        break;
                    }
                    Assert(symOpnd->AsSymOpnd()->IsPropertySymOpnd());

                    const auto inlineCacheIndex = symOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetLdFldInlinee(inlineCacheIndex);
                    if (!inlineeData)
                    {
                        break;
                    }

                    JITTimeFunctionBody * body = inlineeData->GetBody();
                    if (!body)
                    {
                        break;
                    }

                    bool isInlinePhaseOff = PHASE_OFF(Js::InlineCandidatePhase, inlineeData) ||
                                            PHASE_OFF(Js::InlineAccessorsPhase, inlineeData) ||
                                            (getter && PHASE_OFF(Js::InlineGettersPhase, inlineeData)) ||
                                            (!getter && PHASE_OFF(Js::InlineSettersPhase, inlineeData));

                    if (isInlinePhaseOff)
                    {
                        break;
                    }

                    this->InlineGetterSetterFunction(instr, inlineeData, symThis, inlineCacheIndex, getter /*isGetter*/, &isInlined, recursiveInlineDepth);

                    break;
                }

            case Js::OpCode::NewScObjArray:
                // We know we're not going to inline these. Just break out and try to do a fixed function check.
                isCtor = true;
                isBuiltIn = true;
                break;

            case Js::OpCode::NewScObject:
                isCtor = true;
                if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc))
                {
                    break;
                }
                // fall-through

            case Js::OpCode::CallI:
                {

                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    if(!instr->IsProfiledInstr())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                    if(profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        break;
                    }

                    const FunctionJITTimeInfo * inlineeData = inlinerData->GetInlinee(profileId);
                    IR::Instr * callbackDefInstr = nullptr;
                    if (inlineeData == nullptr)
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                        }

                        if (callbackDefInstr == nullptr)
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                    }

                    if (inlineeData != nullptr && inlinerData->IsPolymorphicCallSite(profileId))
                    {
                        if (PHASE_ENABLED(InlineCallbacksPhase, func))
                        {
                            callbackDefInstr = TryGetCallbackDefInstrForCallInstr(instr);
                            if (callbackDefInstr == nullptr)
                            {
                                isPolymorphic = true;
                            }
                        }
                        else
                        {
                            isPolymorphic = true;
                        }
                    }

                    if (callbackDefInstr != nullptr)
                    {
                        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callbackDefInstr->AsProfiledInstr()->u.profileId);
                        inlineeData = callbackDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallbackInlinee(callSiteId);

#if ENABLE_DEBUG_CONFIG_OPTIONS
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        INLINE_CALLBACKS_TRACE(_u("INLINING : Inlining callback at\tCallSite: %d\tCaller: %s (%s)\n"),
                            callSiteId, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
#endif
                    }

                    if (isPolymorphic)
                    {
                        if (isCtor ||
                            (PHASE_OFF(Js::PolymorphicInlinePhase, this->topFunc) || PHASE_OFF(Js::PolymorphicInlinePhase, func)) ||
                            (this->IsInliningOutSideLoops() && !PHASE_FORCE(Js::InlinePhase, this->topFunc) && !PHASE_FORCE(Js::InlinePhase, func)))
                        {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlining polymorphic call site outside loop\tIsConstructorCall: %s \tisTopFunc: %s\tCaller: %s (%s)\n"),
                                     (isCtor? _u("true"): _u("false")), (this->topFunc != func? _u("true"):_u("false")),
                                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));

                            // TODO: Constructor polymorphic inlining

                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            break;
                        }
                        if (!PHASE_OFF(Js::FixedMethodsPhase, this->topFunc) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, this->topFunc))
                        {
                            instrNext = InlinePolymorphicFunctionUsingFixedMethods(instr, inlinerData, symThis, profileId, methodValueOpnd, &isInlined, recursiveInlineDepth);
                        }
                        else
                        {
                            TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                            TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                            instrNext = InlinePolymorphicFunction(instr, inlinerData, symThis, profileId, &isInlined, recursiveInlineDepth);
                        }
                    }
                    else
                    {
                        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                        Js::OpCode builtInInlineCandidateOpCode;
                        ValueType builtInReturnType;

                        // If the inlinee info is the array constructor, just change the opcode to NewScObjArray
                        // so that we will inline the array allocation in lower
                        if (isCtor && inlineeData->GetFunctionInfoAddr() == this->topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
                        {
                            isBuiltIn = true;
                            instr->m_opcode = Js::OpCode::NewScObjArray;
                            instr->AsProfiledInstr()->u.profileId = Js::Constants::NoProfileId;
                            break;
                        }

                        isBuiltIn = InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineCandidateOpCode, &builtInReturnType);

                        if(!builtInReturnType.IsUninitialized() && instr->GetDst())
                        {
                            Assert(!inlineeData->HasBody());
                            AssertMsg(instr->m_opcode != Js::OpCode::NewScObjArray, "We should have broken out of the switch statement earlier on this opcode.");
                            // Value types for the array built-in calls are pulled from the profile; don't change them here.
                            if ((instr->m_opcode != Js::OpCode::NewScObjArray) ||
                                !instr->GetDst()->GetValueType().IsLikelyNativeArray())
                            {
                                // Assume that this built-in function is not going to be inlined, so the return type cannot be definite
                                instr->GetDst()->SetValueType(builtInReturnType.ToLikely());
                            }
                        }

                        bool isInlinePhaseOff = inlineeData->HasBody() ?
                            PHASE_OFF(Js::InlineCandidatePhase, inlineeData) :
                            PHASE_OFF1(Js::InlineBuiltInPhase);
                        if (isInlinePhaseOff)
                        {
                            break;
                        }

                        if(!inlineeData->HasBody() && builtInInlineCandidateOpCode == 0)
                        {
                            // This built-in function is not going to be inlined
                            break;
                        }

                        bool hasDstUsedBuiltInReturnType = false;
                        if(!inlineeData->HasBody())
                        {
                            Assert(builtInInlineCandidateOpCode != 0);
                            if(isCtor)
                            {
                                // Inlining a built-in function called as a constructor is currently not supported. Although InliningDecider
                                // already checks for this, profile data matching with a function does not take into account the difference
                                // between a constructor call and a regular function call, so need to check it again.
                                break;
                            }

                            // This built-in function should be inlined, so reset the destination's value type
                            if(!builtInReturnType.IsUninitialized())
                            {
                                if(instr->GetDst())
                                {
                                    hasDstUsedBuiltInReturnType = true;
                                    instr->GetDst()->SetValueType(builtInReturnType);
                                    if(builtInReturnType.IsDefinite())
                                    {
                                        instr->GetDst()->SetValueTypeFixed();
                                    }
                                }
                            }
                        }
                        else
                        {

                            if (!inlineeData->GetBody()->HasProfileInfo())        // Don't try to inline a function if it doesn't have profile data
                            {
                                break;
                            }

                            uint16 constantArguments = 0;
                            if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                            {
                                instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                                    IR::Opnd *src1 = argInstr->GetSrc1();
                                    if (!src1->IsRegOpnd())
                                    {
                                        return false;
                                    }
                                    StackSym *sym = src1->AsRegOpnd()->m_sym;
                                    if (sym->IsIntConst())
                                    {
                                        if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                                        {
                                            StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                            Assert(dstSym->IsSingleDef());
                                            Assert(dstSym->IsArgSlotSym());
                                            Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                            if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                            {
                                                return true;
                                            }
                                            constantArguments |= (1 << argCount);
                                        }
                                    }
                                    return false;
                                });
                            }

                            if (!inliningHeuristics.BackendInlineIntoInliner(inlineeData,
                                func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                                this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                            {
                                break;
                            }

                        }


                        instrNext = builtInInlineCandidateOpCode != 0 ?
                            this->InlineBuiltInFunction(instr, inlineeData, builtInInlineCandidateOpCode, inlinerData, symThis, &isInlined, profileId, recursiveInlineDepth, instr) :
                            this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, callbackDefInstr, recursiveInlineDepth);
                        if (!isInlined && hasDstUsedBuiltInReturnType)
                        {
                            // We haven't actually inlined the builtin, we need to revert the value type to likely
                            instr->GetDst()->UnsetValueTypeFixed();
                            instr->GetDst()->SetValueType(instr->GetDst()->GetValueType().ToLikely());
                        }
                    }
                    if(++this->inlineesProcessed == inlinerData->GetInlineeCount())
                    {
                        // getterSetter inline caches are shared and we have no way of knowing how many more are present
                        if (!inlinerData->IsLdFldInlineePresent() && !doFixedMethods)
                        {
                            return ;
                        }
                    }
                    break;
                }
            case Js::OpCode::AsmJsCallI:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount() || !instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }
                if (PHASE_OFF(Js::InlineCandidatePhase, inlineeData))
                {
                    break;
                }

                // Don't try to inline a function if it doesn't have profile data
                if (!inlineeData->GetBody()->HasProfileInfo())
                {
                    break;
                }

                uint16 constantArguments = 0;
                if (!PHASE_OFF(Js::InlineRecursivePhase, func))
                {
                    instr->IterateArgInstrs([&](IR::Instr* argInstr) {
                        IR::Opnd *src1 = argInstr->GetSrc1();
                        if (!src1->IsRegOpnd())
                        {
                            return false;
                        }
                        StackSym *sym = src1->AsRegOpnd()->m_sym;
                        if (sym->IsIntConst())
                        {
                            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
                            {
                                StackSym *dstSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
                                Assert(dstSym->IsSingleDef());
                                Assert(dstSym->IsArgSlotSym());
                                Js::ArgSlot argCount = dstSym->GetArgSlotNum() - 1;

                                if (argCount == Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                                {
                                    return true;
                                }
                                constantArguments |= (1 << argCount);
                            }
                        }
                        return false;
                    });
                }

                if (!inliningHeuristics.BackendInlineIntoInliner(
                    inlineeData, func, this->topFunc, profileId, isCtor, true /*isFixedMethodCall*/,
                    this->IsInliningOutSideLoops(), this->isInLoop != 0, recursiveInlineDepth, constantArguments))
                {
                    break;
                }

                instrNext = this->InlineScriptFunction(instr, inlineeData, symThis, profileId, &isInlined, nullptr, recursiveInlineDepth);

                if (++this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    return;
                }

                break;
            }
            case Js::OpCode::CallIExtended:
            {
                if (this->inlineesProcessed == inlinerData->GetInlineeCount())
                {
                    break;
                }

                if (!instr->IsProfiledInstr())
                {
                    break;
                }

                const auto profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
                if (profileId >= func->GetJITFunctionBody()->GetProfiledCallSiteCount())
                {
                    break;
                }

                const auto inlineeData = inlinerData->GetInlinee(profileId);
                if (!inlineeData)
                {
                    break;
                }

                if (Lowerer::IsSpreadCall(instr))
                {
                    InlineSpread(instr);
                }
                break;
            }

            case Js::OpCode::ArgOut_A:
                InlConstFoldArg(instr, callerArgOuts, callerArgOutCount);
                break;

            case Js::OpCode::LdThis:
                Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetDst()->AsRegOpnd()->m_sym;
                break;

            case Js::OpCode::CheckThis:
                // Is this possible? Can we be walking an inlinee here? Doesn't hurt to support this case...
                Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd());
                Assert(symThis == nullptr);

                symThis = instr->GetSrc1()->AsRegOpnd()->m_sym;
                break;

            default:
                {
                    if (loopTop && instr->IsBranchInstr())
                    {
                        // Look for the back edge to loopTop.
                        IR::BranchInstr *branch = instr->AsBranchInstr();
                        IR::LabelInstr *labelDestination = branch->GetTarget();
                        if (labelDestination == loopTop) // We found the back edge
                        {
                            backEdgeCount--;
                            if (backEdgeCount == 0) // We have seen all the back edges, hence we are outside loop now.
                            {
                                Assert(this->isInLoop > 0);
                                --this->isInLoop;
                                loopTop = nullptr;
                            }
                        }
                    }
                }

            }
        }

        // If we chose not to inline, let's try to optimize this call if it uses a fixed method
        if (!isInlined)
        {
            switch (instr->m_opcode)
            {
            case Js::OpCode::NewScObject:
            case Js::OpCode::NewScObjArray:
                isCtor = true;
                // intentionally fall through.
            case Js::OpCode::CallI:
                {
                    IR::PropertySymOpnd* methodValueOpnd = GetMethodLdOpndForCallInstr(instr);

                    TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
                    TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
                    StackSym* originalCallTargetStackSym = instr->GetSrc1()->GetStackSym();
                    bool originalCallTargetOpndIsJITOpt = instr->GetSrc1()->GetIsJITOptimizedReg();
                    bool safeThis = false;
                    if (TryOptimizeCallInstrWithFixedMethod(instr, nullptr, isPolymorphic /*isPolymorphic*/, isBuiltIn /*isBuiltIn*/, isCtor /*isCtor*/, false /*isInlined*/, safeThis /*unused here*/))
                    {
                        Assert(originalCallTargetStackSym != nullptr);

                        // Insert a ByteCodeUsesInstr to make sure the methodValueDstOpnd's constant value is captured by any
                        // bailout that occurs between CheckFixedMethodField and CallI.
                        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(instr);
                        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
                        instr->InsertBefore(useCallTargetInstr);

                        // Split NewScObject into NewScObjectNoCtor and CallI, but don't touch NewScObjectArray.
                        if (instr->m_opcode == Js::OpCode::NewScObject && !PHASE_OFF(Js::SplitNewScObjectPhase, this->topFunc))
                        {
                            SplitConstructorCall(instr, false, true);
                        }
                    }
                    else if (instr->m_opcode == Js::OpCode::NewScObjArray)
                    {
                        if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeArray())
                        {
                            // We expect to create a native array here, so we'll insert a check against the
                            // expected call target, which requires a bailout.
                            instr = instr->ConvertToBailOutInstr(instr, IR::BailOutOnNotNativeArray);
                        }
                    }
                }
                break;
            }
        }
    } NEXT_INSTR_EDITING;

    INLINE_FLUSH();
}